

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_lharx(DisasContext_conflict10 *ctx)

{
  gen_load_locked(ctx,ctx->default_tcg_memop_mask | MO_16);
  return;
}

Assistant:

static void gen_fetch_inc_conditional(DisasContext *ctx, MemOp memop,
                                      TCGv EA, TCGCond cond, int addend)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t = tcg_temp_new(tcg_ctx);
    TCGv t2 = tcg_temp_new(tcg_ctx);
    TCGv u = tcg_temp_new(tcg_ctx);

    tcg_gen_qemu_ld_tl(tcg_ctx, t, EA, ctx->mem_idx, memop);
    tcg_gen_addi_tl(tcg_ctx, t2, EA, MEMOP_GET_SIZE(memop));
    tcg_gen_qemu_ld_tl(tcg_ctx, t2, t2, ctx->mem_idx, memop);
    tcg_gen_addi_tl(tcg_ctx, u, t, addend);

    /* E.g. for fetch and increment bounded... */
    /* mem(EA,s) = (t != t2 ? u = t + 1 : t) */
    tcg_gen_movcond_tl(tcg_ctx, cond, u, t, t2, u, t);
    tcg_gen_qemu_st_tl(tcg_ctx, u, EA, ctx->mem_idx, memop);

    /* RT = (t != t2 ? t : u = 1<<(s*8-1)) */
    tcg_gen_movi_tl(tcg_ctx, u, 1ULL << (MEMOP_GET_SIZE(memop) * 8 - 1));
    tcg_gen_movcond_tl(tcg_ctx, cond, cpu_gpr[rD(ctx->opcode)], t, t2, t, u);

    tcg_temp_free(tcg_ctx, t);
    tcg_temp_free(tcg_ctx, t2);
    tcg_temp_free(tcg_ctx, u);
}